

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

void common::(anonymous_namespace)::
     MergeSettings<common::OnlyHasDefaultSectionSetting(common::Settings_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
               (Settings *settings,string *section,string *name,anon_class_16_2_14b99272 *fn)

{
  long lVar1;
  SettingsSpan span;
  SettingsSpan span_00;
  SettingsSpan span_01;
  SettingsSpan span_02;
  SettingsSpan span_03;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  SettingsValue *in_RCX;
  long in_FS_OFFSET;
  mapped_type *values_2;
  mapped_type *map_1;
  mapped_type *values_1;
  mapped_type *map;
  SettingsValue *value_1;
  mapped_type *values;
  mapped_type *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  SettingsValue *in_stack_ffffffffffffff30;
  SettingsValue *in_stack_ffffffffffffff38;
  SettingsValue *in_stack_ffffffffffffff40;
  SettingsValue *in_stack_ffffffffffffff48;
  mapped_type *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pmVar3 = FindKey<std::map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>const&,std::__cxx11::string_const&>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                       *)in_stack_ffffffffffffff38,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff30);
  if (pmVar3 != (mapped_type *)0x0) {
    in_stack_ffffffffffffff48 = in_RCX;
    SettingsSpan::SettingsSpan((SettingsSpan *)in_stack_ffffffffffffff28,(SettingsValue *)0xdaca04);
    span.size = (size_t)in_stack_ffffffffffffff48;
    span.data = in_stack_ffffffffffffff40;
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
              ((anon_class_16_2_14b99272 *)in_stack_ffffffffffffff38,span,
               (Source)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  pmVar4 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                       *)in_stack_ffffffffffffff38,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff30);
  if (pmVar4 != (mapped_type *)0x0) {
    in_stack_ffffffffffffff40 = in_RCX;
    SettingsSpan::SettingsSpan
              ((SettingsSpan *)in_stack_ffffffffffffff38,
               (vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff30);
    span_00.size = (size_t)in_stack_ffffffffffffff48;
    span_00.data = in_stack_ffffffffffffff40;
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
              ((anon_class_16_2_14b99272 *)in_stack_ffffffffffffff38,span_00,
               (Source)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  pmVar3 = FindKey<std::map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>const&,std::__cxx11::string_const&>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                       *)in_stack_ffffffffffffff38,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff30);
  if (pmVar3 != (mapped_type *)0x0) {
    in_stack_ffffffffffffff38 = in_RCX;
    SettingsSpan::SettingsSpan((SettingsSpan *)in_stack_ffffffffffffff28,(SettingsValue *)0xdacab7);
    span_01.size = (size_t)in_stack_ffffffffffffff48;
    span_01.data = in_stack_ffffffffffffff40;
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
              ((anon_class_16_2_14b99272 *)in_stack_ffffffffffffff38,span_01,
               (Source)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_ffffffffffffff28);
  if (((!bVar2) &&
      (in_stack_ffffffffffffff68 =
            FindKey<std::map<std::__cxx11::string,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>>>>const&,std::__cxx11::string_const&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                        *)in_stack_ffffffffffffff38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff30), in_stack_ffffffffffffff68 != (mapped_type *)0x0))
     && (pmVar4 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                              *)in_stack_ffffffffffffff38,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffff30), pmVar4 != (mapped_type *)0x0)) {
    SettingsSpan::SettingsSpan
              ((SettingsSpan *)in_stack_ffffffffffffff38,
               (vector<UniValue,_std::allocator<UniValue>_> *)in_RCX);
    span_02.size = (size_t)in_stack_ffffffffffffff48;
    span_02.data = in_stack_ffffffffffffff40;
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
              ((anon_class_16_2_14b99272 *)in_stack_ffffffffffffff38,span_02,
               (Source)((ulong)in_RCX >> 0x20));
    in_stack_ffffffffffffff30 = in_RCX;
  }
  pmVar5 = FindKey<std::map<std::__cxx11::string,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>>>>const&,char_const(&)[1]>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                       *)pmVar3,(char (*) [1])in_stack_ffffffffffffff68);
  if ((pmVar5 != (mapped_type *)0x0) &&
     (pmVar4 = FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>const&,std::__cxx11::string_const&>
                         ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                           *)in_stack_ffffffffffffff38,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff30), pmVar4 != (mapped_type *)0x0)) {
    SettingsSpan::SettingsSpan
              ((SettingsSpan *)in_stack_ffffffffffffff38,
               (vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff30);
    span_03.size = (size_t)in_stack_ffffffffffffff48;
    span_03.data = in_stack_ffffffffffffff40;
    OnlyHasDefaultSectionSetting::anon_class_16_2_14b99272::operator()
              ((anon_class_16_2_14b99272 *)in_stack_ffffffffffffff38,span_03,
               (Source)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void MergeSettings(const Settings& settings, const std::string& section, const std::string& name, Fn&& fn)
{
    // Merge in the forced settings
    if (auto* value = FindKey(settings.forced_settings, name)) {
        fn(SettingsSpan(*value), Source::FORCED);
    }
    // Merge in the command-line options
    if (auto* values = FindKey(settings.command_line_options, name)) {
        fn(SettingsSpan(*values), Source::COMMAND_LINE);
    }
    // Merge in the read-write settings
    if (const SettingsValue* value = FindKey(settings.rw_settings, name)) {
        fn(SettingsSpan(*value), Source::RW_SETTINGS);
    }
    // Merge in the network-specific section of the config file
    if (!section.empty()) {
        if (auto* map = FindKey(settings.ro_config, section)) {
            if (auto* values = FindKey(*map, name)) {
                fn(SettingsSpan(*values), Source::CONFIG_FILE_NETWORK_SECTION);
            }
        }
    }
    // Merge in the default section of the config file
    if (auto* map = FindKey(settings.ro_config, "")) {
        if (auto* values = FindKey(*map, name)) {
            fn(SettingsSpan(*values), Source::CONFIG_FILE_DEFAULT_SECTION);
        }
    }
}